

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGReader.cpp
# Opt level: O3

set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> * __thiscall
CFGReader::cfgs(set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *__return_storage_ptr__,
               CFGReader *this)

{
  iterator iVar1;
  const_iterator __position;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  CFG *local_40;
  _Alloc_node local_38;
  
  __position._M_node = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       __position._M_node;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       __position._M_node;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (this->m_cfgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->m_cfgs)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      local_40 = (CFG *)p_Var2[1]._M_parent;
      local_38._M_t = &__return_storage_ptr__->_M_t;
      iVar1 = std::_Rb_tree<CFG*,CFG*,std::_Identity<CFG*>,std::less<CFG*>,std::allocator<CFG*>>::
              _M_insert_unique_<CFG*,std::_Rb_tree<CFG*,CFG*,std::_Identity<CFG*>,std::less<CFG*>,std::allocator<CFG*>>::_Alloc_node>
                        ((_Rb_tree<CFG*,CFG*,std::_Identity<CFG*>,std::less<CFG*>,std::allocator<CFG*>>
                          *)__return_storage_ptr__,__position,&local_40,&local_38);
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<CFG*> CFGReader::cfgs() const {
	std::set<CFG*> cfgs;

	std::transform(m_cfgs.begin(), m_cfgs.end(),
		std::inserter(cfgs, cfgs.begin()),
		[](const std::map<Addr, CFG*>::value_type &pair) {
			return pair.second;
		}
	);

	return cfgs;
}